

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O3

void __thiscall i2p::sam::Session::Disconnect(Session *this)

{
  size_type sVar1;
  Sock *pSVar2;
  bool bVar3;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  
  args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (in_FS_OFFSET + 0x28);
  if ((this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
      super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
      super__Head_base<0UL,_Sock_*,_false>._M_head_impl != (Sock *)0x0) {
    sVar1 = (this->m_session_id)._M_string_length;
    this_00 = LogInstance();
    fmt = (char *)0x8780ba;
    bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,I2P,Info);
    if (sVar1 == 0) {
      if (bVar3) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
        source_file_00._M_len = 0x50;
        logging_function_00._M_str = "Disconnect";
        logging_function_00._M_len = 10;
        ::LogPrintf_<>(logging_function_00,source_file_00,0x1e5,TOR,0xf9883f,fmt);
      }
    }
    else if (bVar3) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      source_file._M_len = 0x50;
      logging_function._M_str = "Disconnect";
      logging_function._M_len = 10;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x1e7,TOR,0xf98862,(char *)&this->m_session_id,args);
    }
    pSVar2 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>.
             _M_t.super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
             super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
    _M_head_impl = (Sock *)0x0;
    if (pSVar2 != (Sock *)0x0) {
      (*pSVar2->_vptr_Sock[1])();
    }
  }
  (this->m_session_id)._M_string_length = 0;
  *(this->m_session_id)._M_dataplus._M_p = '\0';
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      != args) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Session::Disconnect()
{
    if (m_control_sock) {
        if (m_session_id.empty()) {
            LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "Destroying incomplete SAM session\n");
        } else {
            LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "Destroying SAM session %s\n", m_session_id);
        }
        m_control_sock.reset();
    }
    m_session_id.clear();
}